

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_fast_force
              (char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  int iVar1;
  U32 UVar2;
  U32 UVar3;
  U32 UVar4;
  uint uVar5;
  BYTE *pBVar6;
  char *pcVar7;
  tableType_t tableType;
  bool bVar8;
  undefined1 local_4270 [8];
  LZ4_stream_t ctx;
  int acceleration_local;
  int maxOutputSize_local;
  int inputSize_local;
  char *dest_local;
  char *source_local;
  char *local_228;
  size_t accumulator_1;
  size_t lastRun_1;
  uint more_1;
  BYTE *limit_1;
  uint matchLength_1;
  int len_1;
  uint litLength_1;
  U32 h_1;
  uint searchMatchNb_1;
  uint step_1;
  BYTE *forwardIp_1;
  BYTE *token_1;
  BYTE *match_1;
  size_t refDelta_1;
  U32 forwardH_1;
  BYTE *olimit_1;
  BYTE *op_1;
  BYTE *matchlimit_1;
  BYTE *mflimit_1;
  BYTE *iend_1;
  BYTE *anchor_1;
  size_t dictDelta_1;
  BYTE *dictEnd_1;
  BYTE *dictionary_1;
  BYTE *lowRefLimit_1;
  BYTE *lowLimit_1;
  BYTE *base_1;
  BYTE *ip_1;
  LZ4_stream_t_internal *dictPtr_1;
  int local_11c;
  char *local_118;
  size_t accumulator;
  size_t lastRun;
  uint more;
  BYTE *limit;
  uint matchLength;
  int len;
  uint litLength;
  U32 h;
  uint searchMatchNb;
  uint step;
  BYTE *forwardIp;
  BYTE *token;
  BYTE *match;
  size_t refDelta;
  U32 forwardH;
  BYTE *olimit;
  BYTE *op;
  BYTE *matchlimit;
  BYTE *mflimit;
  BYTE *iend;
  BYTE *anchor;
  size_t dictDelta;
  BYTE *dictEnd;
  BYTE *dictionary;
  BYTE *lowRefLimit;
  BYTE *lowLimit;
  BYTE *base;
  BYTE *ip;
  LZ4_stream_t_internal *dictPtr;
  int local_c;
  
  ctx.table[0x803]._4_4_ = acceleration;
  LZ4_resetStream((LZ4_stream_t *)local_4270);
  iVar1 = ctx.table[0x803]._4_4_;
  if (inputSize < 0x1000b) {
    if ((uint)inputSize < 0x7e000001) {
      if (inputSize < 0x1000b) {
        olimit = (BYTE *)dest;
        iend = (BYTE *)source;
        if (inputSize < 0xd) {
LAB_00258307:
          pcVar7 = source + ((long)inputSize - (long)iend);
          if ((BYTE *)(ulong)(uint)maxOutputSize <
              olimit + (long)(pcVar7 + (ulong)(pcVar7 + 0xf0) / 0xff + (1 - (long)dest))) {
            local_c = 0;
          }
          else {
            if (pcVar7 < (char *)0xf) {
              *olimit = (char)pcVar7 * '\x10';
              olimit = olimit + 1;
            }
            else {
              *olimit = 0xf0;
              pBVar6 = olimit;
              for (local_118 = pcVar7 + -0xf; olimit = pBVar6 + 1, (char *)0xfe < local_118;
                  local_118 = local_118 + -0xff) {
                *olimit = 0xff;
                pBVar6 = olimit;
              }
              *olimit = (BYTE)local_118;
              olimit = pBVar6 + 2;
            }
            memcpy(olimit,iend,(size_t)pcVar7);
            local_c = ((int)pcVar7 + (int)olimit) - (int)dest;
          }
        }
        else {
          LZ4_putPosition((BYTE *)source,local_4270,byU16,(BYTE *)source);
          base = (BYTE *)(source + 1);
          refDelta._4_4_ = LZ4_hashPosition(base,byU16);
          while( true ) {
            _searchMatchNb = base;
            h = 1;
            litLength = iVar1 << 6;
            do {
              base = _searchMatchNb;
              pBVar6 = _searchMatchNb + h;
              h = litLength >> 6;
              if (source + (long)inputSize + -0xc < pBVar6) goto LAB_00258307;
              token = LZ4_getPositionOnHash(refDelta._4_4_,local_4270,byU16,(BYTE *)source);
              UVar2 = LZ4_hashPosition(pBVar6,byU16);
              LZ4_putPositionOnHash(_searchMatchNb,refDelta._4_4_,local_4270,byU16,(BYTE *)source);
              UVar3 = LZ4_read32(token);
              UVar4 = LZ4_read32(_searchMatchNb);
              litLength = litLength + 1;
              _searchMatchNb = pBVar6;
              refDelta._4_4_ = UVar2;
            } while (UVar3 != UVar4);
            while( true ) {
              bVar8 = false;
              if ((iend < base) && (bVar8 = false, source < token)) {
                bVar8 = base[-1] == token[-1];
              }
              if (!bVar8) break;
              base = base + -1;
              token = token + -1;
            }
            uVar5 = (int)base - (int)iend;
            pBVar6 = olimit + 1;
            forwardIp = olimit;
            if (dest + maxOutputSize < pBVar6 + (ulong)uVar5 / 0xff + (ulong)uVar5 + 8) break;
            if (uVar5 < 0xf) {
              *olimit = (char)uVar5 * '\x10';
              olimit = pBVar6;
            }
            else {
              *olimit = 0xf0;
              olimit = pBVar6;
              for (limit._4_4_ = uVar5 - 0xf; 0xfe < limit._4_4_; limit._4_4_ = limit._4_4_ + -0xff)
              {
                *olimit = 0xff;
                olimit = olimit + 1;
              }
              *olimit = (BYTE)limit._4_4_;
              olimit = olimit + 1;
            }
            LZ4_wildCopy(olimit,iend,olimit + uVar5);
            olimit = olimit + uVar5;
            while( true ) {
              LZ4_writeLE16(olimit,(short)base - (short)token);
              uVar5 = LZ4_count(base + 4,token + 4,(BYTE *)(source + (long)inputSize + -5));
              iend = base + (uVar5 + 4);
              if (dest + maxOutputSize < olimit + (ulong)(uVar5 >> 8) + 8) {
                local_c = 0;
                goto LAB_0025847a;
              }
              if (uVar5 < 0xf) {
                *forwardIp = *forwardIp + (char)uVar5;
                olimit = olimit + 2;
              }
              else {
                *forwardIp = *forwardIp + '\x0f';
                olimit = olimit + 2;
                for (limit._0_4_ = uVar5 - 0xf; 0x1fd < (uint)limit;
                    limit._0_4_ = (uint)limit - 0x1fe) {
                  pBVar6 = olimit + 1;
                  *olimit = 0xff;
                  olimit = olimit + 2;
                  *pBVar6 = 0xff;
                }
                if (0xfe < (uint)limit) {
                  limit._0_4_ = (uint)limit - 0xff;
                  *olimit = 0xff;
                  olimit = olimit + 1;
                }
                *olimit = (BYTE)(uint)limit;
                olimit = olimit + 1;
              }
              if (source + (long)inputSize + -0xc < iend) goto LAB_00258307;
              LZ4_putPosition(iend + -2,local_4270,byU16,(BYTE *)source);
              token = LZ4_getPosition(iend,local_4270,byU16,(BYTE *)source);
              LZ4_putPosition(iend,local_4270,byU16,(BYTE *)source);
              if (token + 0xffff < iend) break;
              UVar2 = LZ4_read32(token);
              UVar3 = LZ4_read32(iend);
              if (UVar2 != UVar3) break;
              forwardIp = olimit;
              *olimit = '\0';
              olimit = olimit + 1;
              base = iend;
            }
            base = iend + 1;
            refDelta._4_4_ = LZ4_hashPosition(base,byU16);
          }
          local_c = 0;
        }
      }
      else {
        local_c = 0;
      }
    }
    else {
      local_c = 0;
    }
LAB_0025847a:
    source_local._4_4_ = local_c;
  }
  else {
    uVar5 = LZ4_64bits();
    iVar1 = ctx.table[0x803]._4_4_;
    tableType = (tableType_t)(uVar5 != 0);
    if ((uint)inputSize < 0x7e000001) {
      if ((tableType == byU16) && (0x1000a < inputSize)) {
        local_11c = 0;
      }
      else {
        olimit_1 = (BYTE *)dest;
        iend_1 = (BYTE *)source;
        if (inputSize < 0xd) {
LAB_00258fcb:
          pcVar7 = source + ((long)inputSize - (long)iend_1);
          if ((BYTE *)(ulong)(uint)maxOutputSize <
              olimit_1 + (long)(pcVar7 + (ulong)(pcVar7 + 0xf0) / 0xff + (1 - (long)dest))) {
            local_11c = 0;
          }
          else {
            if (pcVar7 < (char *)0xf) {
              *olimit_1 = (char)pcVar7 * '\x10';
              olimit_1 = olimit_1 + 1;
            }
            else {
              *olimit_1 = 0xf0;
              pBVar6 = olimit_1;
              for (local_228 = pcVar7 + -0xf; olimit_1 = pBVar6 + 1, (char *)0xfe < local_228;
                  local_228 = local_228 + -0xff) {
                *olimit_1 = 0xff;
                pBVar6 = olimit_1;
              }
              *olimit_1 = (BYTE)local_228;
              olimit_1 = pBVar6 + 2;
            }
            memcpy(olimit_1,iend_1,(size_t)pcVar7);
            local_11c = ((int)pcVar7 + (int)olimit_1) - (int)dest;
          }
        }
        else {
          LZ4_putPosition((BYTE *)source,local_4270,tableType,(BYTE *)source);
          base_1 = (BYTE *)(source + 1);
          refDelta_1._4_4_ = LZ4_hashPosition(base_1,tableType);
          while( true ) {
            _searchMatchNb_1 = base_1;
            h_1 = 1;
            litLength_1 = iVar1 << 6;
            do {
              base_1 = _searchMatchNb_1;
              pBVar6 = _searchMatchNb_1 + h_1;
              h_1 = litLength_1 >> 6;
              if (source + (long)inputSize + -0xc < pBVar6) goto LAB_00258fcb;
              token_1 = LZ4_getPositionOnHash(refDelta_1._4_4_,local_4270,tableType,(BYTE *)source);
              UVar2 = LZ4_hashPosition(pBVar6,tableType);
              LZ4_putPositionOnHash
                        (_searchMatchNb_1,refDelta_1._4_4_,local_4270,tableType,(BYTE *)source);
              if ((tableType == byU16) || (bVar8 = true, _searchMatchNb_1 <= token_1 + 0xffff)) {
                UVar3 = LZ4_read32(token_1);
                UVar4 = LZ4_read32(_searchMatchNb_1);
                bVar8 = UVar3 != UVar4;
              }
              litLength_1 = litLength_1 + 1;
              _searchMatchNb_1 = pBVar6;
              refDelta_1._4_4_ = UVar2;
            } while (bVar8);
            while( true ) {
              bVar8 = false;
              if ((iend_1 < base_1) && (bVar8 = false, source < token_1)) {
                bVar8 = base_1[-1] == token_1[-1];
              }
              if (!bVar8) break;
              base_1 = base_1 + -1;
              token_1 = token_1 + -1;
            }
            uVar5 = (int)base_1 - (int)iend_1;
            pBVar6 = olimit_1 + 1;
            forwardIp_1 = olimit_1;
            if (dest + maxOutputSize < pBVar6 + (ulong)uVar5 / 0xff + (ulong)uVar5 + 8) break;
            if (uVar5 < 0xf) {
              *olimit_1 = (char)uVar5 * '\x10';
              olimit_1 = pBVar6;
            }
            else {
              *olimit_1 = 0xf0;
              olimit_1 = pBVar6;
              for (limit_1._4_4_ = uVar5 - 0xf; 0xfe < limit_1._4_4_;
                  limit_1._4_4_ = limit_1._4_4_ + -0xff) {
                *olimit_1 = 0xff;
                olimit_1 = olimit_1 + 1;
              }
              *olimit_1 = (BYTE)limit_1._4_4_;
              olimit_1 = olimit_1 + 1;
            }
            LZ4_wildCopy(olimit_1,iend_1,olimit_1 + uVar5);
            olimit_1 = olimit_1 + uVar5;
            while( true ) {
              LZ4_writeLE16(olimit_1,(short)base_1 - (short)token_1);
              uVar5 = LZ4_count(base_1 + 4,token_1 + 4,(BYTE *)(source + (long)inputSize + -5));
              iend_1 = base_1 + (uVar5 + 4);
              if (dest + maxOutputSize < olimit_1 + (ulong)(uVar5 >> 8) + 8) {
                local_11c = 0;
                goto LAB_00259150;
              }
              if (uVar5 < 0xf) {
                *forwardIp_1 = *forwardIp_1 + (char)uVar5;
                olimit_1 = olimit_1 + 2;
              }
              else {
                *forwardIp_1 = *forwardIp_1 + '\x0f';
                olimit_1 = olimit_1 + 2;
                for (limit_1._0_4_ = uVar5 - 0xf; 0x1fd < (uint)limit_1;
                    limit_1._0_4_ = (uint)limit_1 - 0x1fe) {
                  pBVar6 = olimit_1 + 1;
                  *olimit_1 = 0xff;
                  olimit_1 = olimit_1 + 2;
                  *pBVar6 = 0xff;
                }
                if (0xfe < (uint)limit_1) {
                  limit_1._0_4_ = (uint)limit_1 - 0xff;
                  *olimit_1 = 0xff;
                  olimit_1 = olimit_1 + 1;
                }
                *olimit_1 = (BYTE)(uint)limit_1;
                olimit_1 = olimit_1 + 1;
              }
              if (source + (long)inputSize + -0xc < iend_1) goto LAB_00258fcb;
              LZ4_putPosition(iend_1 + -2,local_4270,tableType,(BYTE *)source);
              token_1 = LZ4_getPosition(iend_1,local_4270,tableType,(BYTE *)source);
              LZ4_putPosition(iend_1,local_4270,tableType,(BYTE *)source);
              if (token_1 + 0xffff < iend_1) break;
              UVar2 = LZ4_read32(token_1);
              UVar3 = LZ4_read32(iend_1);
              if (UVar2 != UVar3) break;
              forwardIp_1 = olimit_1;
              *olimit_1 = '\0';
              olimit_1 = olimit_1 + 1;
              base_1 = iend_1;
            }
            base_1 = iend_1 + 1;
            refDelta_1._4_4_ = LZ4_hashPosition(base_1,tableType);
          }
          local_11c = 0;
        }
      }
    }
    else {
      local_11c = 0;
    }
LAB_00259150:
    source_local._4_4_ = local_11c;
  }
  return source_local._4_4_;
}

Assistant:

int LZ4_compress_fast_force(const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t ctx;

    LZ4_resetStream(&ctx);

    if (inputSize < LZ4_64Klimit)
        return LZ4_compress_generic(&ctx, source, dest, inputSize, maxOutputSize, limitedOutput, byU16,                        noDict, noDictIssue, acceleration);
    else
        return LZ4_compress_generic(&ctx, source, dest, inputSize, maxOutputSize, limitedOutput, LZ4_64bits() ? byU32 : byPtr, noDict, noDictIssue, acceleration);
}